

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamplerTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::samplers::Sampler_testProbabilisticSamplerErrors_Test::TestBody
          (Sampler_testProbabilisticSamplerErrors_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_148 [8];
  Message local_140 [8];
  double local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_3;
  Message local_110 [8];
  double local_108;
  int local_fc;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_b8 [8];
  Message local_b0 [8];
  double local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_80 [8];
  Message local_78 [24];
  double local_60;
  int local_54;
  undefined1 local_50 [8];
  AssertionResult gtest_ar;
  ProbabilisticSampler sampler;
  Sampler_testProbabilisticSamplerErrors_Test *this_local;
  
  ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar.message_,-0.1);
  local_54 = 0;
  local_60 = ProbabilisticSampler::samplingRate((ProbabilisticSampler *)&gtest_ar.message_);
  testing::internal::CmpHelperLE<int,double>
            ((internal *)local_50,"0","sampler.samplingRate()",&local_54,&local_60);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_50);
  if (!bVar1) {
    testing::Message::Message(local_78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_50);
    testing::internal::AssertHelper::AssertHelper
              (local_80,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(local_80,local_78);
    testing::internal::AssertHelper::~AssertHelper(local_80);
    testing::Message::~Message(local_78);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_50);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    local_9c = 1;
    local_a8 = ProbabilisticSampler::samplingRate((ProbabilisticSampler *)&gtest_ar.message_);
    testing::internal::CmpHelperGE<int,double>
              ((internal *)local_98,"1","sampler.samplingRate()",&local_9c,&local_a8);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
    if (!bVar1) {
      testing::Message::Message(local_b0);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
      testing::internal::AssertHelper::AssertHelper
                (local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                 ,0x6a,pcVar2);
      testing::internal::AssertHelper::operator=(local_b8,local_b0);
      testing::internal::AssertHelper::~AssertHelper(local_b8);
      testing::Message::~Message(local_b0);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      ProbabilisticSampler::ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar_2.message_,1.1);
      ProbabilisticSampler::operator=
                ((ProbabilisticSampler *)&gtest_ar.message_,
                 (ProbabilisticSampler *)&gtest_ar_2.message_);
      ProbabilisticSampler::~ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar_2.message_);
      local_fc = 0;
      local_108 = ProbabilisticSampler::samplingRate((ProbabilisticSampler *)&gtest_ar.message_);
      testing::internal::CmpHelperLE<int,double>
                ((internal *)local_f8,"0","sampler.samplingRate()",&local_fc,&local_108);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(local_110);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                   ,0x6c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_110);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(local_110);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        local_12c = 1;
        local_138 = ProbabilisticSampler::samplingRate((ProbabilisticSampler *)&gtest_ar.message_);
        testing::internal::CmpHelperGE<int,double>
                  ((internal *)local_128,"1","sampler.samplingRate()",&local_12c,&local_138);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
        if (!bVar1) {
          testing::Message::Message(local_140);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
          testing::internal::AssertHelper::AssertHelper
                    (local_148,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/samplers/SamplerTest.cpp"
                     ,0x6d,pcVar2);
          testing::internal::AssertHelper::operator=(local_148,local_140);
          testing::internal::AssertHelper::~AssertHelper(local_148);
          testing::Message::~Message(local_140);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  ProbabilisticSampler::~ProbabilisticSampler((ProbabilisticSampler *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Sampler, testProbabilisticSamplerErrors)
{
    ProbabilisticSampler sampler(-0.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
    sampler = ProbabilisticSampler(1.1);
    ASSERT_LE(0, sampler.samplingRate());
    ASSERT_GE(1, sampler.samplingRate());
}